

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void ModulusHelper<long,_long_long,_0>::
     ModulusThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (long *t,longlong *u,long *result)

{
  long lVar1;
  
  lVar1 = *u;
  if (lVar1 == -1) {
    lVar1 = 0;
  }
  else {
    if (lVar1 == 0) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    lVar1 = *t % lVar1;
  }
  *result = lVar1;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        //trap corner case
        if (mod_corner_case<U, std::numeric_limits< U >::is_signed >::is_undefined(u))
        {
            result = 0;
            return;
        }

        result = (T)(t % u);
    }